

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O0

void __thiscall
wasm::SubTypes::SubTypes
          (SubTypes *this,vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  bool bVar1;
  reference pHVar2;
  HeapType type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types_local;
  SubTypes *this_local;
  
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&this->types,types);
  std::
  unordered_map<wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  ::unordered_map(&this->typeSubTypes);
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(types);
  type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                *)&type);
    if (!bVar1) break;
    pHVar2 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    note(this,(HeapType)pHVar2->id);
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

SubTypes(const std::vector<HeapType>& types) : types(types) {
    for (auto type : types) {
      note(type);
    }
  }